

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

LY_ERR lys_parse(ly_ctx *ctx,ly_in *in,LYS_INFORMAT format,char **features,lys_module **module)

{
  lys_glob_unres *unres;
  int iVar1;
  LY_ERR LVar2;
  size_t sVar3;
  ushort **ppuVar4;
  char *pcVar5;
  lys_module *mod;
  lys_module *local_40;
  char **local_38;
  
  if (module != (lys_module **)0x0) {
    *module = (lys_module *)0x0;
  }
  if (ctx == (ly_ctx *)0x0) {
    pcVar5 = "ctx";
  }
  else {
    if (in != (ly_in *)0x0) {
      local_38 = features;
      if ((format == LYS_IN_UNKNOWN) && (format = LYS_IN_UNKNOWN, in->type == LY_IN_FILEPATH)) {
        pcVar5 = (in->method).fpath.filepath;
        sVar3 = strlen(pcVar5);
        if (sVar3 != 0) {
          ppuVar4 = __ctype_b_loc();
          do {
            if ((*(byte *)((long)*ppuVar4 + (long)pcVar5[sVar3 - 1] * 2 + 1) & 0x20) == 0)
            goto LAB_0015cffe;
            sVar3 = sVar3 - 1;
          } while (sVar3 != 0);
          sVar3 = 0;
        }
LAB_0015cffe:
        if ((sVar3 < 6) || (iVar1 = strncmp(pcVar5 + (sVar3 - 5),".yang",5), iVar1 != 0)) {
          if (4 < sVar3) {
            iVar1 = strncmp(pcVar5 + (sVar3 - 4),".yin",4);
            format = (uint)(iVar1 == 0) * 3;
          }
        }
        else {
          format = LYS_IN_YANG;
        }
      }
      if (format != LYS_IN_UNKNOWN) {
        in->func_start = in->current;
        unres = &ctx->unres;
        LVar2 = lys_parse_in(ctx,in,format,
                             (_func_LY_ERR_ly_ctx_ptr_lysp_module_ptr_lysp_submodule_ptr_void_ptr *)
                             0x0,(void *)0x0,&(ctx->unres).creating,&local_40);
        if ((((LVar2 == LY_SUCCESS) &&
             (LVar2 = _lys_set_implemented(local_40,local_38,unres), LVar2 == LY_SUCCESS)) &&
            (LVar2 = LY_SUCCESS, (ctx->flags & 0x80) == 0)) &&
           ((LVar2 = lys_unres_dep_sets_create(ctx,&unres->dep_sets,local_40), LVar2 == LY_SUCCESS
            && (LVar2 = lys_compile_depset_all(ctx,unres), LVar2 == LY_SUCCESS)))) {
          lys_unres_glob_erase(unres);
          LVar2 = LY_SUCCESS;
        }
        if (LVar2 != LY_SUCCESS) {
          lys_unres_glob_revert(ctx,unres);
          lys_unres_glob_erase(unres);
          return LVar2;
        }
        if (module == (lys_module **)0x0) {
          return LY_SUCCESS;
        }
        *module = local_40;
        return LY_SUCCESS;
      }
      pcVar5 = "format";
      goto LAB_0015d078;
    }
    pcVar5 = "in";
  }
  ctx = (ly_ctx *)0x0;
LAB_0015d078:
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"lys_parse");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_parse(struct ly_ctx *ctx, struct ly_in *in, LYS_INFORMAT format, const char **features, struct lys_module **module)
{
    LY_ERR ret = LY_SUCCESS;
    struct lys_module *mod;

    if (module) {
        *module = NULL;
    }
    LY_CHECK_ARG_RET(NULL, ctx, in, LY_EINVAL);

    format = lys_parse_get_format(in, format);
    LY_CHECK_ARG_RET(ctx, format, LY_EINVAL);

    /* remember input position */
    in->func_start = in->current;

    /* parse */
    ret = lys_parse_in(ctx, in, format, NULL, NULL, &ctx->unres.creating, &mod);
    LY_CHECK_GOTO(ret, cleanup);

    /* implement */
    ret = _lys_set_implemented(mod, features, &ctx->unres);
    LY_CHECK_GOTO(ret, cleanup);

    if (!(ctx->flags & LY_CTX_EXPLICIT_COMPILE)) {
        /* create dep set for the module and mark all the modules that will be (re)compiled */
        LY_CHECK_GOTO(ret = lys_unres_dep_sets_create(ctx, &ctx->unres.dep_sets, mod), cleanup);

        /* (re)compile the whole dep set (other dep sets will have no modules marked for compilation) */
        LY_CHECK_GOTO(ret = lys_compile_depset_all(ctx, &ctx->unres), cleanup);

        /* unres resolved */
        lys_unres_glob_erase(&ctx->unres);
    }

cleanup:
    if (ret) {
        lys_unres_glob_revert(ctx, &ctx->unres);
        lys_unres_glob_erase(&ctx->unres);
    } else if (module) {
        *module = mod;
    }
    return ret;
}